

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

void __thiscall
Assimp::ASEImporter::AddNodes
          (ASEImporter *this,
          vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes,
          aiNode *pcParent,char *szName,aiMatrix4x4 *mat)

{
  string *__lhs;
  float fVar1;
  pointer ppBVar2;
  BaseNode *snode;
  size_type sVar3;
  undefined8 uVar4;
  bool bVar5;
  _IEEESingle temp_1;
  int iVar6;
  aiNode *paVar7;
  aiNode **ppaVar8;
  aiNode *this_00;
  ulong uVar9;
  Logger *this_01;
  long lVar10;
  pointer ppaVar11;
  char *sz;
  pointer ppBVar12;
  pointer ppaVar13;
  uint p;
  vector<aiNode_*,_std::allocator<aiNode_*>_> apcNodes;
  size_type local_108;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4 mParentAdjust;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (szName == (char *)0x0) {
    local_108 = 0;
  }
  else {
    local_108 = strlen(szName);
  }
  apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ppBVar12 = (nodes->
             super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  ppBVar2 = (nodes->
            super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    ppaVar13 = apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ppaVar11 = apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppBVar12 == ppBVar2) {
      lVar10 = (long)apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      pcParent->mNumChildren = (uint)lVar10;
      if ((uint)lVar10 != 0) {
        ppaVar8 = (aiNode **)operator_new__(-(ulong)(lVar10 + 1U >> 0x3d != 0) | lVar10 * 8 + 8U);
        pcParent->mChildren = ppaVar8;
        for (uVar9 = 0; uVar9 < (ulong)((long)ppaVar13 - (long)ppaVar11 >> 3);
            uVar9 = (ulong)((int)uVar9 + 1)) {
          pcParent->mChildren[uVar9] = ppaVar11[uVar9];
          ppaVar11 = apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppaVar13 = apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
      }
      std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base
                (&apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>);
      return;
    }
    snode = *ppBVar12;
    sVar3 = (snode->mParent)._M_string_length;
    if (szName == (char *)0x0) {
      if (sVar3 == 0) goto LAB_003732e7;
    }
    else if ((local_108 == sVar3) &&
            (iVar6 = strcmp(szName,(snode->mParent)._M_dataplus._M_p), iVar6 == 0)) {
LAB_003732e7:
      snode->mProcessed = true;
      paVar7 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar7);
      mParentAdjust._0_8_ = paVar7;
      std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                ((vector<aiNode*,std::allocator<aiNode*>> *)&apcNodes,(aiNode **)&mParentAdjust);
      __lhs = &snode->mName;
      sz = "Unnamed_Node";
      if ((snode->mName)._M_string_length != 0) {
        sz = (__lhs->_M_dataplus)._M_p;
      }
      paVar7 = apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
      aiString::Set(&paVar7->mName,sz);
      paVar7->mParent = pcParent;
      mParentAdjust.a1 = mat->a1;
      mParentAdjust.a2 = mat->a2;
      mParentAdjust.a3 = mat->a3;
      mParentAdjust.a4 = mat->a4;
      mParentAdjust.b1 = mat->b1;
      mParentAdjust.b2 = mat->b2;
      mParentAdjust.b3 = mat->b3;
      mParentAdjust.b4 = mat->b4;
      mParentAdjust.c1 = mat->c1;
      mParentAdjust.c2 = mat->c2;
      mParentAdjust.c3 = mat->c3;
      mParentAdjust.c4 = mat->c4;
      mParentAdjust.d1 = mat->d1;
      mParentAdjust.d2 = mat->d2;
      mParentAdjust.d3 = mat->d3;
      mParentAdjust.d4 = mat->d4;
      aiMatrix4x4t<float>::Inverse(&mParentAdjust);
      temp.d1 = mParentAdjust.d1;
      temp.d2 = mParentAdjust.d2;
      temp.d3 = mParentAdjust.d3;
      temp.d4 = mParentAdjust.d4;
      temp.c1 = mParentAdjust.c1;
      temp.c2 = mParentAdjust.c2;
      temp.c3 = mParentAdjust.c3;
      temp.c4 = mParentAdjust.c4;
      temp.b1 = mParentAdjust.b1;
      temp.b2 = mParentAdjust.b2;
      temp.b3 = mParentAdjust.b3;
      temp.b4 = mParentAdjust.b4;
      temp.a1 = mParentAdjust.a1;
      temp.a2 = mParentAdjust.a2;
      temp.a3 = mParentAdjust.a3;
      temp.a4 = mParentAdjust.a4;
      aiMatrix4x4t<float>::operator*=(&temp,&snode->mTransform);
      (paVar7->mTransformation).d1 = temp.d1;
      (paVar7->mTransformation).d2 = temp.d2;
      (paVar7->mTransformation).d3 = temp.d3;
      (paVar7->mTransformation).d4 = temp.d4;
      (paVar7->mTransformation).c1 = temp.c1;
      (paVar7->mTransformation).c2 = temp.c2;
      (paVar7->mTransformation).c3 = temp.c3;
      (paVar7->mTransformation).c4 = temp.c4;
      (paVar7->mTransformation).b1 = temp.b1;
      (paVar7->mTransformation).b2 = temp.b2;
      (paVar7->mTransformation).b3 = temp.b3;
      (paVar7->mTransformation).b4 = temp.b4;
      (paVar7->mTransformation).a1 = temp.a1;
      (paVar7->mTransformation).a2 = temp.a2;
      (paVar7->mTransformation).a3 = temp.a3;
      (paVar7->mTransformation).a4 = temp.a4;
      bVar5 = aiString::operator!=(&paVar7->mName,&paVar7->mParent->mName);
      if ((bVar5) &&
         (bVar5 = aiString::operator!=(&paVar7->mName,&paVar7->mParent->mParent->mName), bVar5)) {
        AddNodes(this,nodes,paVar7,(paVar7->mName).data,&snode->mTransform);
      }
      if (snode->mType == Mesh) {
        AddMeshes(this,snode,paVar7);
      }
      else {
        fVar1 = (snode->mTargetPosition).x;
        if ((~(uint)fVar1 & 0x7f800000) != 0 || ((uint)fVar1 & 0x7fffff) == 0) {
          if (paVar7->mNumChildren == 0) {
            ppaVar8 = (aiNode **)operator_new__(8);
            paVar7->mChildren = ppaVar8;
          }
          this_00 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_00);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                         __lhs,".Target");
          uVar4 = temp._8_8_;
          if ((ulong)temp._8_8_ < 0x400) {
            (this_00->mName).length = (ai_uint32)temp.a3;
            memcpy((this_00->mName).data,(void *)temp._0_8_,temp._8_8_);
            (this_00->mName).data[uVar4] = '\0';
          }
          std::__cxx11::string::~string((string *)&temp);
          (this_00->mTransformation).a4 = (snode->mTargetPosition).x - (snode->mTransform).a4;
          (this_00->mTransformation).b4 = (snode->mTargetPosition).y - (snode->mTransform).b4;
          (this_00->mTransformation).c4 = (snode->mTargetPosition).z - (snode->mTransform).c4;
          this_00->mParent = paVar7;
          for (uVar9 = 0; ppaVar8 = paVar7->mChildren, uVar9 < paVar7->mNumChildren;
              uVar9 = uVar9 + 1) {
            ppaVar8[uVar9 + 1] = ppaVar8[uVar9];
          }
          *ppaVar8 = this_00;
          paVar7->mNumChildren = paVar7->mNumChildren + 1;
          this_01 = DefaultLogger::get();
          std::operator+(&local_50,"ASE: Generating separate target node (",__lhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                         &local_50,")");
          Logger::debug(this_01,(char *)temp._0_8_);
          std::__cxx11::string::~string((string *)&temp);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
    ppBVar12 = ppBVar12 + 1;
  } while( true );
}

Assistant:

void ASEImporter::AddNodes (const std::vector<BaseNode*>& nodes,
    aiNode* pcParent, const char* szName,
    const aiMatrix4x4& mat)
{
    const size_t len = szName ? ::strlen(szName) : 0;
    ai_assert(4 <= AI_MAX_NUMBER_OF_COLOR_SETS);

    // Receives child nodes for the pcParent node
    std::vector<aiNode*> apcNodes;

    // Now iterate through all nodes in the scene and search for one
    // which has *us* as parent.
    for (std::vector<BaseNode*>::const_iterator it = nodes.begin(), end = nodes.end(); it != end; ++it) {
        const BaseNode* snode = *it;
        if (szName) {
            if (len != snode->mParent.length() || ::strcmp(szName,snode->mParent.c_str()))
                continue;
        }
        else if (snode->mParent.length())
            continue;

        (*it)->mProcessed = true;

        // Allocate a new node and add it to the output data structure
        apcNodes.push_back(new aiNode());
        aiNode* node = apcNodes.back();

        node->mName.Set((snode->mName.length() ? snode->mName.c_str() : "Unnamed_Node"));
        node->mParent = pcParent;

        // Setup the transformation matrix of the node
        aiMatrix4x4 mParentAdjust  = mat;
        mParentAdjust.Inverse();
        node->mTransformation = mParentAdjust*snode->mTransform;

        // Add sub nodes - prevent stack overflow due to recursive parenting
        if (node->mName != node->mParent->mName && node->mName != node->mParent->mParent->mName ) {
            AddNodes(nodes,node,node->mName.data,snode->mTransform);
        }

        // Further processing depends on the type of the node
        if (snode->mType == ASE::BaseNode::Mesh)    {
            // If the type of this node is "Mesh" we need to search
            // the list of output meshes in the data structure for
            // all those that belonged to this node once. This is
            // slightly inconvinient here and a better solution should
            // be used when this code is refactored next.
            AddMeshes(snode,node);
        }
        else if (is_not_qnan( snode->mTargetPosition.x ))   {
            // If this is a target camera or light we generate a small
            // child node which marks the position of the camera
            // target (the direction information is contained in *this*
            // node's animation track but the exact target position
            // would be lost otherwise)
            if (!node->mNumChildren)    {
                node->mChildren = new aiNode*[1];
            }

            aiNode* nd = new aiNode();

            nd->mName.Set ( snode->mName + ".Target" );

            nd->mTransformation.a4 = snode->mTargetPosition.x - snode->mTransform.a4;
            nd->mTransformation.b4 = snode->mTargetPosition.y - snode->mTransform.b4;
            nd->mTransformation.c4 = snode->mTargetPosition.z - snode->mTransform.c4;

            nd->mParent = node;

            // The .Target node is always the first child node
            for (unsigned int m = 0; m < node->mNumChildren;++m)
                node->mChildren[m+1] = node->mChildren[m];

            node->mChildren[0] = nd;
            node->mNumChildren++;

            // What we did is so great, it is at least worth a debug message
            ASSIMP_LOG_DEBUG("ASE: Generating separate target node ("+snode->mName+")");
        }
    }

    // Allocate enough space for the child nodes
    // We allocate one slot more  in case this is a target camera/light
    pcParent->mNumChildren = (unsigned int)apcNodes.size();
    if (pcParent->mNumChildren) {
        pcParent->mChildren = new aiNode*[apcNodes.size()+1 /* PLUS ONE !!! */];

        // now build all nodes for our nice new children
        for (unsigned int p = 0; p < apcNodes.size();++p)
            pcParent->mChildren[p] = apcNodes[p];
    }
    return;
}